

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  List<int> list;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _func_int *local_8c;
  undefined4 local_84;
  Thread local_80;
  List<int> local_40;
  
  local_80.super_Object._vptr_Object = &local_8c;
  local_8c = (_func_int *)0x200000001;
  local_84 = 3;
  local_80.pthread = 3;
  cplus::utils::List<int>::List(&local_40,(initializer_list<int> *)&local_80);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/main.cpp:91:9)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/main.cpp:91:9)>
             ::_M_manager;
  cplus::thread::Thread::Thread(&local_80,(function<void_()> *)&local_b8);
  cplus::thread::Thread::start(&local_80);
  cplus::thread::Thread::~Thread(&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  cplus::thread::Thread::exitThread();
  cplus::utils::List<int>::~List(&local_40);
  return 0;
}

Assistant:

int main() {
	cplus::utils::List<int> list{1, 2, 3};
	//启动服务器
	Thread([]() -> void {
		SocketServer server(port);
		server.listen();
		println({&String::getString("server started at port: "), &Short::get(port)});
		auto buffer = ByteBuffer(1024);
		while (true) {
			auto socket = server.accept();
			try {
				println({&String::getString("server got connection from:"), &socket.getAddress()});
				while (true) {
					socket.read(buffer);
					println({&String::getString("server recv from:"), &socket.getAddress()});
					println({String::getString(">>>"), buffer.getString()});
					socket.write(buffer);
				}
			} catch (const Exception &e) {
				std::cerr << e.getMessage().c_str() << std::endl
				          << e.getStackTrace().c_str() << std::endl;
				socket.close();
			} catch (const std::exception &e) {
				std::cerr << "server exception: " << e.what() << std::endl;
				socket.close();
			} catch (int e) {
				std::cerr << e << std::endl;
				socket.close();
			}
		}
	}).start();


//	Thread::msleep(100);
//	try {
//		auto message = ByteArray("hello?", sizeof("hello?"));
//		auto socket = Socket("127.0.0.1", port);
//
//		socket.connect();
//		println(2, &String::getString("connecting to server: localhost: )"),
//		        &String::getString(String(port)));
//
//		Thread::msleep(100);
//		ssize_t sendSize = socket.send(message);
//		if (sendSize == -1) {
//		throw Exception("send error: " + Long(errno).toString());
//		} else {
//			println(2, &String::getString("sending size: "),
//			        &String::getString(String(sendSize)));
//		}
//
//		auto recv = socket.recv(1024);
//		println(2, &String::getString("recving from server:\n>>>"),
//		        &String::getString(String(recv)));
	
	//} catch (Exception e) {
	//	std::cerr << e.getMessage().c_str() << std::endl
	//	          << e.getStackTrace().c_str() << std::endl;
	//} catch (std::exception e) {
	//	std::cerr << "client exception: " << e.what() << std::endl;
	//}

//	ServerHandler serverHandler;
//	Thread([]() {
//		try {
//			u_int16_t port = 12346;
//			SocketServer server(port);
//			ByteArray recv(1024);
//			std::cout << "server started at port " << port << std::endl;
//			while (true) {
//				auto socket = server.accept();
//				std::cout << "get connection on: " << socket.getAddress().stdString()
//				          << ":" << socket.getPort() << std::endl;
//				socket.recv(recv);
//				socket.send(recv);
//				std::cout << String(recv).stdString() << std::endl;
//				std::cout << recv.toHexString().stdString() << std::endl;
//				if (String(recv.getBuffer()) == String("exit"))
//					break;
//			}
//		} catch (SocketServer::ServerException e) {
//			std::cerr << e.getMessage().stdString() << std::endl;
//		}
//	}).start();
//	Thread::detachAll();
	Thread::exitThread();
}